

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall TPZReducedSpace::InitMaterialData(TPZReducedSpace *this,TPZMaterialData *data)

{
  TPZCompEl *this_00;
  TPZConnect *this_01;
  TPZGeoEl *pTVar1;
  long in_RSI;
  long *in_RDI;
  int dim;
  int nstate;
  int nshape;
  TPZConnect *c;
  TPZMatSingleSpace *mat;
  long *local_48;
  
  *(undefined4 *)(in_RSI + 8) = 3;
  this_00 = (TPZCompEl *)(**(code **)(*in_RDI + 0xb8))();
  if (this_00 == (TPZCompEl *)0x0) {
    local_48 = (long *)0x0;
  }
  else {
    local_48 = (long *)__dynamic_cast(this_00,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                      0xfffffffffffffffe);
  }
  (**(code **)(*local_48 + 0x48))(local_48,in_RSI);
  this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,0);
  TPZConnect::NShape(this_01);
  TPZConnect::NState(this_01);
  pTVar1 = TPZCompEl::Reference(this_00);
  (**(code **)(*(long *)pTVar1 + 0x210))();
  TPZFMatrix<double>::Resize((TPZFMatrix<double> *)data,(int64_t)mat,(int64_t)c);
  TPZFMatrix<double>::Resize((TPZFMatrix<double> *)data,(int64_t)mat,(int64_t)c);
  TPZFMatrix<double>::Resize((TPZFMatrix<double> *)data,(int64_t)mat,(int64_t)c);
  TPZFMatrix<double>::Resize((TPZFMatrix<double> *)data,(int64_t)mat,(int64_t)c);
  TPZFMatrix<double>::Resize((TPZFMatrix<double> *)data,(int64_t)mat,(int64_t)c);
  return;
}

Assistant:

void TPZReducedSpace::InitMaterialData(TPZMaterialData &data)
{
    data.fShapeType = TPZMaterialData::EVecShape;
    auto *mat =
        dynamic_cast<TPZMatSingleSpace*>(this->Material());
    mat->FillDataRequirements(data);
    TPZConnect &c = Connect(0);
    int nshape = c.NShape();
    int nstate = c.NState();
    int dim = Reference()->Dimension();
    data.phi.Resize(nshape, nstate);
    data.dphix.Resize(dim*nstate,nshape);
    data.jacobian.Resize(dim,dim);
    data.jacinv.Resize(dim,dim);
    data.axes.Resize(dim, 3);
}